

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTMain.cpp
# Opt level: O2

string * ts2string_abi_cxx11_(string *__return_storage_ptr__,double _zt,int secDecimals)

{
  double dVar1;
  double dVar2;
  string local_b8;
  char s [100];
  
  ts2string_abi_cxx11_(&local_b8,(long)_zt);
  dVar1 = fmod(_zt,1.0);
  dVar2 = pow(10.0,(double)secDecimals);
  snprintf(s,100,"%s.%dZ",local_b8._M_dataplus._M_p,(ulong)(uint)(int)(dVar2 * dVar1));
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,s,(allocator<char> *)&local_b8);
  return __return_storage_ptr__;
}

Assistant:

std::string ts2string (double _zt, int secDecimals)
{
    char s[100];
    snprintf(s, sizeof(s), "%s.%dZ",
             ts2string(time_t(_zt)).c_str(),
             int(std::fmod(_zt, 1.0f) * std::pow(10.0,secDecimals)) );
    return std::string(s);
}